

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeCommandListAppendLaunchCooperativeKernelPrologue
          (ZEHandleLifetimeValidation *this,ze_command_list_handle_t hCommandList,
          ze_kernel_handle_t hKernel,ze_group_count_t *pLaunchFuncArgs,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  long lVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hCommandList);
  if (bVar2) {
    bVar2 = HandleLifetimeValidation::isOpen
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hCommandList);
    if (!bVar2) {
      return ZE_RESULT_ERROR_INVALID_ARGUMENT;
    }
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hKernel);
    if ((bVar2) &&
       ((hSignalEvent == (ze_event_handle_t)0x0 ||
        (bVar2 = HandleLifetimeValidation::isHandleValid
                           (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hSignalEvent), bVar2)))) {
      if (phWaitEvents == (ze_event_handle_t *)0x0) {
        return ZE_RESULT_SUCCESS;
      }
      uVar3 = 0;
      do {
        if (numWaitEvents == uVar3) {
          return ZE_RESULT_SUCCESS;
        }
        bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phWaitEvents[uVar3]);
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeCommandListAppendLaunchCooperativeKernelPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        const ze_group_count_t* pLaunchFuncArgs,        ///< [in] thread group launch arguments
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandList )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (!context.handleLifetime->isOpen( hCommandList )){
            return ZE_RESULT_ERROR_INVALID_ARGUMENT;
        }
        if ( !context.handleLifetime->isHandleValid( hKernel )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (hSignalEvent && !context.handleLifetime->isHandleValid( hSignalEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phWaitEvents) && (i < numWaitEvents); ++i){
            if (!context.handleLifetime->isHandleValid( phWaitEvents[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }